

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

boolean herb_can_grow_at(level *lev,xchar x,xchar y,boolean watery)

{
  char cVar1;
  long lVar2;
  bool local_2a;
  bool local_29;
  rm *loc;
  boolean watery_local;
  xchar y_local;
  xchar x_local;
  level *lev_local;
  
  cVar1 = inside_shop(lev,x,y);
  if (cVar1 == '\0') {
    if (watery == '\0') {
      local_2a = false;
      if (((*(uint *)&lev->locations[x][y].field_0x6 >> 10 & 1) != 0) &&
         (((lev->locations[x][y].typ == '\x19' || (lev->locations[x][y].typ == '\x18')) ||
          ((local_2a = false, lev->locations[x][y].typ == '\x17' &&
           ((((*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1f) == 0 ||
             ((*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1f) == 2)) ||
            (local_2a = false, (*(uint *)&lev->locations[x][y].field_0x6 >> 4 & 0x1f) == 1)))))))) {
        lVar2 = count_herbs_at(lev,x,y,'\0');
        local_2a = lVar2 < 3;
      }
      lev_local._7_1_ = local_2a;
    }
    else {
      local_29 = false;
      if (('\x10' < lev->locations[x][y].typ) &&
         (local_29 = false, lev->locations[x][y].typ < '\x15')) {
        lVar2 = count_herbs_at(lev,x,y,watery);
        local_29 = lVar2 < 3;
      }
      lev_local._7_1_ = local_29;
    }
  }
  else {
    lev_local._7_1_ = false;
  }
  return lev_local._7_1_;
}

Assistant:

static boolean herb_can_grow_at(struct level *lev, xchar x, xchar y, boolean watery)
{
	struct rm *loc = &lev->locations[x][y];
	if (inside_shop(lev, x, y))
	    return FALSE;
	if (watery)
	    return IS_POOL(loc->typ) &&
		   count_herbs_at(lev, x, y, watery) < HERB_GROWTH_LIMIT;
	return loc->lit &&
	       (loc->typ == ROOM || loc->typ == CORR ||
		(IS_DOOR(loc->typ) &&
		 (loc->doormask == D_NODOOR ||
		  loc->doormask == D_ISOPEN ||
		  loc->doormask == D_BROKEN))) &&
	       count_herbs_at(lev, x, y, watery) < HERB_GROWTH_LIMIT;
}